

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_parsedUnitsRequiringImports_Test::~Units_parsedUnitsRequiringImports_Test
          (Units_parsedUnitsRequiringImports_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, parsedUnitsRequiringImports)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("requires_imports.cellml"));

    // When parsing a model it's hard to know whether the units it uses are imported
    // or not if the import is in a child units item.  Using the Units::requiresImports()
    // function should tell us.

    EXPECT_EQ(size_t(3), model->unitsCount());
    EXPECT_FALSE(model->units("grandpa")->isImport());
    EXPECT_TRUE(model->units("grandpa")->requiresImports());
}